

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void supsmu(double *x,int N,double *y,double *w,int periodic,double span,double alpha,double *oup)

{
  double *sc;
  double *w_00;
  ulong uVar1;
  char *__s;
  ulong uVar2;
  double local_58;
  double span_local;
  double alpha_local;
  double *local_40;
  int local_38;
  int local_34;
  int N_local;
  int iper;
  
  local_58 = span;
  span_local = alpha;
  alpha_local = (double)oup;
  local_40 = y;
  local_38 = N;
  sc = (double *)calloc((long)(N * 7),8);
  if (periodic - 1U < 2) {
    local_34 = periodic;
    if ((0.0 <= span) && (span <= 1.0)) {
      if (w == (double *)0x0) {
        w_00 = (double *)calloc((long)N,8);
        uVar1 = 0;
        uVar2 = (ulong)(uint)N;
        if (N < 1) {
          uVar2 = uVar1;
        }
        for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
          w_00[uVar1] = 1.0;
        }
        supsmu_(&local_38,x,local_40,w_00,&local_34,&local_58,&span_local,(double *)alpha_local,sc);
        free(w_00);
      }
      else {
        supsmu_(&local_38,x,local_40,w,&local_34,&local_58,&span_local,(double *)alpha_local,sc);
      }
      free(sc);
      return;
    }
    puts(
        "The fractional data span to use (0 <= span < 1).If specified, then use the given fixed span."
        );
    __s = "If set to zero (default) then use a variable span.";
  }
  else {
    puts("periodic only takes two values - 1 or 2 ");
    puts(" 1 : x is ordered interval variable ");
    __s = "2 : x is a periodic variable with values in the range (0.0,1.0) and period 1.0.";
  }
  puts(__s);
  exit(-1);
}

Assistant:

void supsmu(double *x, int N, double *y,double *w, int periodic,double span, double alpha,double *oup) {
	/* input: */
	/*    N : number of observations (x,y - pairs). */
	/*    x(N) : ordered abscissa values. */
	/*    y(N) : corresponding ordinate (response) values. */
	/*    w(N) : weight for each (x,y) observation. set to NULL if all weights are equal. */
	/*    periodic : periodic variable flag. */
	/*       iper=1 => x is ordered interval variable. */
	/*       iper=2 => x is a periodic variable with values */
	/*                 in the range (0.0,1.0) and period 1.0. */
	/*    span : smoother span (fraction of observations in window). */
	/*           span=0.0 => automatic (variable) span selection. */
	/*    alpha : controles high frequency (small span) penality */
	/*            used with automatic span selection (bass tone control). */
	/*            (alpha.le.0.0 or alpha.gt.10.0 => no effect.). Set to -1.0 */
	/* output: */
	/*   oup(N) : smoothed ordinate (response) values. */
	double *sc,*weights;
	int iper,i;

	sc = (double*)calloc(N*7,sizeof(double));

	if (periodic == 1 || periodic == 2) {
		iper = periodic;
	} else {
		printf("periodic only takes two values - 1 or 2 \n");
		printf(" 1 : x is ordered interval variable \n");
		printf("2 : x is a periodic variable with values in the range (0.0,1.0) and period 1.0.\n");
		exit(-1);
	}

	if (span < 0.0 || span > 1.0) {
		printf("The fractional data span to use (0 <= span < 1).If specified, then use the given fixed span.\n");
        printf("If set to zero (default) then use a variable span.\n");
		exit(-1);
	}

	if (w == NULL) {
		weights = (double*)calloc(N,sizeof(double));
		for(i = 0; i < N;++i) {
			weights[i] = 1.0;
		}
		supsmu_(&N, x, y, weights, &iper, &span, &alpha, oup, sc);
		free(weights);
	} else {
		supsmu_(&N, x, y, w, &iper, &span, &alpha, oup, sc);
	}

	

	free(sc);
}